

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
vkt::tessellation::generateReferenceTriangleTessCoords
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,SpacingMode spacingMode,int inner,int outer0,int outer1,
          int outer2)

{
  int i;
  long lVar1;
  ulong uVar2;
  int iVar3;
  undefined4 in_register_00000014;
  Vector<float,_3> *pVVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  Vec3 corners [3];
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Vector<float,_3> res_2;
  Vector<float,_3> local_d8;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  pointer local_98;
  uint local_88;
  float local_84;
  float local_80;
  float local_7c;
  ulong local_78;
  float local_70 [4];
  float local_60 [4];
  Vector<float,_3> local_50;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_40;
  ulong local_38;
  
  local_a8 = (void *)0x0;
  uStack_a0 = 0;
  local_98 = (pointer)0x0;
  if (inner == 1) {
    if (outer2 != 1 || (outer1 != 1 || outer0 != 1)) {
      generateReferenceTriangleTessCoords
                (__return_storage_ptr__,spacingMode,spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2,
                 outer0,outer1,outer2);
      if (local_a8 == (void *)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_a8,(long)local_98 - (long)local_a8);
      return __return_storage_ptr__;
    }
    local_d8.m_data[0] = 1.0;
    local_d8.m_data[1] = 0.0;
    local_d8.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
               &local_d8);
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 1.0;
    local_d8.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
               &local_d8);
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_d8.m_data[2] = 1.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
               &local_d8);
  }
  else {
    local_78 = CONCAT44(in_register_00000014,inner);
    local_40 = __return_storage_ptr__;
    if (0 < outer0) {
      iVar6 = 0;
      do {
        local_d8.m_data[2] = 1.0 - (float)iVar6 / (float)outer0;
        local_d8.m_data._0_8_ = (ulong)(uint)((float)iVar6 / (float)outer0) << 0x20;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
                   &local_d8);
        iVar6 = iVar6 + 1;
      } while (outer0 != iVar6);
    }
    if (0 < outer1) {
      iVar6 = 0;
      do {
        local_d8.m_data[2] = (float)iVar6 / (float)outer1;
        local_d8.m_data[1] = 0.0;
        local_d8.m_data[0] = 1.0 - local_d8.m_data[2];
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
                   &local_d8);
        iVar6 = iVar6 + 1;
      } while (outer1 != iVar6);
    }
    if (0 < outer2) {
      iVar6 = 0;
      do {
        local_d8.m_data[1] = 1.0 - (float)iVar6 / (float)outer2;
        local_d8.m_data[0] = (float)iVar6 / (float)outer2;
        local_d8.m_data[2] = 0.0;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
                   &local_d8);
        iVar6 = iVar6 + 1;
      } while (outer2 != iVar6);
    }
    local_ac = (int)local_78;
    if (1 < local_ac) {
      uVar7 = (int)(((uint)(local_78 >> 0x1f) & 1) + local_ac) >> 1;
      local_84 = (float)(local_ac * 3);
      uVar2 = 0;
      local_88 = uVar7;
      uVar8 = local_78;
      do {
        local_ac = local_ac + -2;
        iVar3 = (int)uVar2 * 2 + 2;
        iVar6 = (int)uVar8 - iVar3;
        if (iVar6 == 0) {
          local_d8.m_data[0] = 0.33333334;
          local_d8.m_data[1] = 0.33333334;
          local_d8.m_data[2] = 0.33333334;
          std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
          emplace_back<tcu::Vector<float,3>>
                    ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_a8,
                     &local_d8);
        }
        else {
          local_38 = uVar2;
          local_d8.m_data[1] = (float)iVar3 / local_84;
          local_d8.m_data[0] = 1.0 - (local_d8.m_data[1] + local_d8.m_data[1]);
          local_d8.m_data[2] = local_d8.m_data[1];
          local_cc = local_d8.m_data[1];
          local_c8 = local_d8.m_data[0];
          local_c4 = local_d8.m_data[1];
          local_c0 = local_d8.m_data[1];
          local_bc = local_d8.m_data[1];
          local_b8 = local_d8.m_data[0];
          uVar8 = local_78;
          uVar2 = local_38;
          uVar7 = local_88;
          if (0 < iVar6) {
            local_80 = (float)iVar6;
            iVar6 = 0;
            do {
              fVar9 = (float)iVar6 / local_80;
              local_7c = 1.0 - fVar9;
              pVVar4 = &local_d8;
              uVar8 = 0;
              do {
                local_60[2] = 0.0;
                local_60[0] = 0.0;
                local_60[1] = 0.0;
                lVar1 = 0;
                do {
                  local_60[lVar1] = pVVar4->m_data[lVar1] * local_7c;
                  lVar1 = lVar1 + 1;
                } while (lVar1 != 3);
                uVar8 = uVar8 + 1;
                uVar2 = uVar8 & 0xffffffff;
                if (uVar8 == 3) {
                  uVar2 = 0;
                }
                local_70[0] = 0.0;
                local_70[1] = 0.0;
                local_70[2] = 0.0;
                lVar1 = 0;
                do {
                  local_70[lVar1] = (&local_d8)[uVar2].m_data[lVar1] * fVar9;
                  lVar1 = lVar1 + 1;
                } while (lVar1 != 3);
                local_50.m_data[2] = 0.0;
                local_50.m_data[0] = 0.0;
                local_50.m_data[1] = 0.0;
                lVar1 = 0;
                do {
                  local_50.m_data[lVar1] = local_60[lVar1] + local_70[lVar1];
                  lVar1 = lVar1 + 1;
                } while (lVar1 != 3);
                std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
                emplace_back<tcu::Vector<float,3>>
                          ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)
                           &local_a8,&local_50);
                pVVar4 = pVVar4 + 1;
              } while (uVar8 != 3);
              iVar6 = iVar6 + 1;
              uVar8 = local_78;
              uVar2 = local_38;
              uVar7 = local_88;
            } while (iVar6 != local_ac);
          }
        }
        uVar5 = (int)uVar2 + 1;
        uVar2 = (ulong)uVar5;
      } while (uVar5 != uVar7);
    }
    __return_storage_ptr__ = local_40;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (undefined4)local_a8;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_start + 4) = local_a8._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (undefined4)uStack_a0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_finish + 4) = uStack_a0._4_4_;
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_98;
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::Vec3> generateReferenceTriangleTessCoords (const SpacingMode	spacingMode,
															const int			inner,
															const int			outer0,
															const int			outer1,
															const int			outer2)
{
	std::vector<tcu::Vec3> tessCoords;

	if (inner == 1)
	{
		if (outer0 == 1 && outer1 == 1 && outer2 == 1)
		{
			tessCoords.push_back(tcu::Vec3(1.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(0.0f, 1.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(0.0f, 0.0f, 1.0f));
			return tessCoords;
		}
		else
			return generateReferenceTriangleTessCoords(spacingMode, spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
													   outer0, outer1, outer2);
	}
	else
	{
		for (int i = 0; i < outer0; i++) { const float v = (float)i / (float)outer0; tessCoords.push_back(tcu::Vec3(    0.0f,        v, 1.0f - v)); }
		for (int i = 0; i < outer1; i++) { const float v = (float)i / (float)outer1; tessCoords.push_back(tcu::Vec3(1.0f - v,     0.0f,        v)); }
		for (int i = 0; i < outer2; i++) { const float v = (float)i / (float)outer2; tessCoords.push_back(tcu::Vec3(       v, 1.0f - v,     0.0f)); }

		const int numInnerTriangles = inner/2;
		for (int innerTriangleNdx = 0; innerTriangleNdx < numInnerTriangles; innerTriangleNdx++)
		{
			const int curInnerTriangleLevel = inner - 2*(innerTriangleNdx+1);

			if (curInnerTriangleLevel == 0)
				tessCoords.push_back(tcu::Vec3(1.0f/3.0f));
			else
			{
				const float		minUVW		= (float)(2 * (innerTriangleNdx + 1)) / (float)(3 * inner);
				const float		maxUVW		= 1.0f - 2.0f*minUVW;
				const tcu::Vec3	corners[3]	=
				{
					tcu::Vec3(maxUVW, minUVW, minUVW),
					tcu::Vec3(minUVW, maxUVW, minUVW),
					tcu::Vec3(minUVW, minUVW, maxUVW)
				};

				for (int i = 0; i < curInnerTriangleLevel; i++)
				{
					const float f = (float)i / (float)curInnerTriangleLevel;
					for (int j = 0; j < 3; j++)
						tessCoords.push_back((1.0f - f)*corners[j] + f*corners[(j+1)%3]);
				}
			}
		}

		return tessCoords;
	}
}